

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void __thiscall polyscope::Histogram::buildUI(Histogram *this,float width)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  ImU32 col;
  undefined4 extraout_var;
  ImDrawList *this_00;
  float fVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float local_88;
  float local_78;
  ImVec2 local_60;
  ImVec4 local_58;
  ImVec4 local_48;
  ImVec2 local_30;
  ImVec2 local_28;
  undefined1 extraout_var_00 [56];
  
  renderToTexture(this);
  local_88 = width;
  if ((width == -1.0) && (!NAN(width))) {
    local_88 = ImGui::GetWindowWidth();
    local_88 = local_88 * 0.8;
  }
  iVar4 = (*((this->texturebuffer).
             super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_TextureBuffer[8])();
  local_60.y = local_88 / 3.0;
  local_60.x = local_88;
  local_28.x = 0.0;
  local_28.y = 1.0;
  local_30 = (ImVec2)vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_48.x = 1.0;
  local_48.y = 1.0;
  local_48.z = 1.0;
  local_48.w = 1.0;
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.z = 0.0;
  local_58.w = 0.0;
  ImGui::Image((ImTextureID)CONCAT44(extraout_var,iVar4),&local_60,&local_28,&local_30,&local_48,
               &local_58);
  bVar3 = ImGui::IsItemHovered(0);
  if (bVar3) {
    IVar6 = ImGui::GetMousePos();
    IVar7 = ImGui::GetCursorScreenPos();
    local_78 = IVar6.x;
    fVar5 = ImGui::GetScrollX();
    dVar1 = (this->dataRange).first;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1;
    fVar5 = (local_78 - IVar7.x) - fVar5;
    auVar11._0_8_ = (double)(fVar5 / local_88);
    auVar11._8_8_ = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->dataRange).second - dVar1;
    auVar2 = vfmadd213sd_fma(auVar8,auVar11,auVar12);
    ImGui::SetTooltip("%g",auVar2._0_8_);
    IVar6 = ImGui::GetCursorScreenPos();
    auVar10._0_8_ = ImGui::GetCursorScreenPos();
    auVar10._8_56_ = extraout_var_00;
    auVar11 = vmovshdup_avx(auVar10._0_16_);
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_4_ = IVar6.x;
    auVar2._4_4_ = IVar6.y;
    auVar2 = vblendps_avx(auVar10._0_16_,auVar2,0xd);
    auVar8 = vblendps_avx(ZEXT416((uint)fVar5),_DAT_00423a90,0xe);
    auVar9._0_4_ = auVar8._0_4_ + auVar2._0_4_;
    auVar9._4_4_ = auVar8._4_4_ + auVar2._4_4_;
    auVar9._8_4_ = auVar8._8_4_ + auVar2._8_4_;
    auVar9._12_4_ = auVar8._12_4_ + auVar2._12_4_;
    local_58.y = (auVar11._0_4_ - local_88 / 3.0) + -3.0;
    local_58.x = auVar9._0_4_;
    local_60 = (ImVec2)vmovlps_avx(auVar9);
    this_00 = ImGui::GetWindowDrawList();
    local_48.x = 0.99607843;
    local_48.y = 0.8666667;
    local_48.z = 0.25882354;
    local_48.w = 1.0;
    col = ImGui::ColorConvertFloat4ToU32(&local_48);
    ImDrawList::AddLine(this_00,(ImVec2 *)&local_58,&local_60,col,1.0);
  }
  bVar3 = ImGui::BeginPopupContextItem("select type",1);
  if (bVar3) {
    if (this->hasWeighted == true) {
      ImGui::Checkbox("Weighted",&this->useWeighted);
    }
    ImGui::Checkbox("Smoothed",&this->useSmoothed);
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void Histogram::buildUI(float width) {
  renderToTexture();

  // Compute size for image
  float aspect = 3.0;
  float w = width;
  if (w == -1.0) {
    w = .8 * ImGui::GetWindowWidth();
  }
  float h = w / aspect;

  // Render image
  ImGui::Image(texturebuffer->getNativeHandle(), ImVec2(w, h), ImVec2(0, 1), ImVec2(1, 0));

  // Draw a cursor popup on mouseover
  if (ImGui::IsItemHovered()) {

    // Get mouse x coodinate within image
    float mouseX = ImGui::GetMousePos().x - ImGui::GetCursorScreenPos().x - ImGui::GetScrollX();
    double mouseT = mouseX / w;
    double val = dataRange.first + mouseT * (dataRange.second - dataRange.first);

    ImGui::SetTooltip("%g", val);

    // Draw line
    ImVec2 imageUpperLeft(ImGui::GetCursorScreenPos().x, ImGui::GetCursorScreenPos().y);
    ImVec2 lineStart(imageUpperLeft.x + mouseX, imageUpperLeft.y - h - 3);
    ImVec2 lineEnd(imageUpperLeft.x + mouseX, imageUpperLeft.y - 4);
    ImGui::GetWindowDrawList()->AddLine(lineStart, lineEnd,
                                        ImGui::ColorConvertFloat4ToU32(ImVec4(254 / 255., 221 / 255., 66 / 255., 1.0)));
  }

  // Right-click combobox to select weighted/unweighted
  if (ImGui::BeginPopupContextItem("select type")) {
    if (hasWeighted) {
      ImGui::Checkbox("Weighted", &useWeighted);
    }
    ImGui::Checkbox("Smoothed", &useSmoothed);
    ImGui::EndPopup();
  }
}